

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O0

void __thiscall
ClipperLib::ClipperOffset::Execute(ClipperOffset *this,PolyTree *solution,double delta)

{
  PolyNode *this_00;
  value_type pPVar1;
  PolyNode *pPVar2;
  int iVar3;
  reference pvVar4;
  reference ppPVar5;
  int local_1d4;
  int i;
  PolyNode *outerNode;
  cInt cStack_1c0;
  IntPoint local_1b8;
  IntPoint local_1a8;
  IntPoint local_198;
  allocator<ClipperLib::IntPoint> local_181;
  undefined1 local_180 [8];
  Path outer;
  IntRect r;
  undefined1 local_138 [8];
  Clipper clpr;
  double delta_local;
  PolyTree *solution_local;
  ClipperOffset *this_local;
  
  clpr._272_8_ = delta;
  PolyTree::Clear(solution);
  FixOrientations(this);
  DoOffset(this,(double)clpr._272_8_);
  Clipper::Clipper((Clipper *)local_138,0);
  ClipperBase::AddPaths
            ((ClipperBase *)(local_138 + (long)*(_func_int **)((long)local_138 + -0x18)),
             &this->m_destPolys,ptSubject,true);
  if (0.0 < (double)clpr._272_8_) {
    Clipper::Execute((Clipper *)local_138,ctUnion,solution,pftPositive,pftPositive);
    goto LAB_001e2056;
  }
  ClipperBase::GetBounds
            ((IntRect *)
             &outer.super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,
             (ClipperBase *)(local_138 + (long)*(_func_int **)((long)local_138 + -0x18)));
  std::allocator<ClipperLib::IntPoint>::allocator(&local_181);
  std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>::vector
            ((vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_> *)local_180,4,
             &local_181);
  std::allocator<ClipperLib::IntPoint>::~allocator(&local_181);
  IntPoint::IntPoint(&local_198,
                     (cInt)((long)&outer.
                                   super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage[-1].X + 6),
                     r.right + 10);
  pvVar4 = std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>::operator[]
                     ((vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_> *)
                      local_180,0);
  pvVar4->X = local_198.X;
  pvVar4->Y = local_198.Y;
  IntPoint::IntPoint(&local_1a8,r.top + 10,r.right + 10);
  pvVar4 = std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>::operator[]
                     ((vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_> *)
                      local_180,1);
  pvVar4->X = local_1a8.X;
  pvVar4->Y = local_1a8.Y;
  IntPoint::IntPoint(&local_1b8,r.top + 10,r.left + -10);
  pvVar4 = std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>::operator[]
                     ((vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_> *)
                      local_180,2);
  pvVar4->X = local_1b8.X;
  pvVar4->Y = local_1b8.Y;
  IntPoint::IntPoint((IntPoint *)&outerNode,
                     (cInt)((long)&outer.
                                   super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage[-1].X + 6),
                     r.left + -10);
  pvVar4 = std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>::operator[]
                     ((vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_> *)
                      local_180,3);
  pvVar4->X = (cInt)outerNode;
  pvVar4->Y = cStack_1c0;
  ClipperBase::AddPath
            ((ClipperBase *)(local_138 + (long)*(_func_int **)((long)local_138 + -0x18)),
             (vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_> *)local_180,
             ptSubject,true);
  Clipper::ReverseSolution((Clipper *)local_138,true);
  Clipper::Execute((Clipper *)local_138,ctUnion,solution,pftNegative,pftNegative);
  iVar3 = PolyNode::ChildCount((PolyNode *)solution);
  if (iVar3 == 1) {
    ppPVar5 = std::vector<ClipperLib::PolyNode_*,_std::allocator<ClipperLib::PolyNode_*>_>::
              operator[]((vector<ClipperLib::PolyNode_*,_std::allocator<ClipperLib::PolyNode_*>_> *)
                         (solution + 0x20),0);
    iVar3 = PolyNode::ChildCount(*ppPVar5);
    if (iVar3 < 1) goto LAB_001e203d;
    ppPVar5 = std::vector<ClipperLib::PolyNode_*,_std::allocator<ClipperLib::PolyNode_*>_>::
              operator[]((vector<ClipperLib::PolyNode_*,_std::allocator<ClipperLib::PolyNode_*>_> *)
                         (solution + 0x20),0);
    this_00 = *ppPVar5;
    iVar3 = PolyNode::ChildCount(this_00);
    std::vector<ClipperLib::PolyNode_*,_std::allocator<ClipperLib::PolyNode_*>_>::reserve
              ((vector<ClipperLib::PolyNode_*,_std::allocator<ClipperLib::PolyNode_*>_> *)
               (solution + 0x20),(long)iVar3);
    ppPVar5 = std::vector<ClipperLib::PolyNode_*,_std::allocator<ClipperLib::PolyNode_*>_>::
              operator[](&this_00->Childs,0);
    pPVar1 = *ppPVar5;
    ppPVar5 = std::vector<ClipperLib::PolyNode_*,_std::allocator<ClipperLib::PolyNode_*>_>::
              operator[]((vector<ClipperLib::PolyNode_*,_std::allocator<ClipperLib::PolyNode_*>_> *)
                         (solution + 0x20),0);
    *ppPVar5 = pPVar1;
    pPVar2 = this_00->Parent;
    ppPVar5 = std::vector<ClipperLib::PolyNode_*,_std::allocator<ClipperLib::PolyNode_*>_>::
              operator[]((vector<ClipperLib::PolyNode_*,_std::allocator<ClipperLib::PolyNode_*>_> *)
                         (solution + 0x20),0);
    (*ppPVar5)->Parent = pPVar2;
    for (local_1d4 = 1; iVar3 = PolyNode::ChildCount(this_00), local_1d4 < iVar3;
        local_1d4 = local_1d4 + 1) {
      ppPVar5 = std::vector<ClipperLib::PolyNode_*,_std::allocator<ClipperLib::PolyNode_*>_>::
                operator[](&this_00->Childs,(long)local_1d4);
      PolyNode::AddChild((PolyNode *)solution,*ppPVar5);
    }
  }
  else {
LAB_001e203d:
    PolyTree::Clear(solution);
  }
  std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>::~vector
            ((vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_> *)local_180);
LAB_001e2056:
  Clipper::~Clipper((Clipper *)local_138);
  return;
}

Assistant:

void ClipperOffset::Execute(PolyTree& solution, double delta)
{
  solution.Clear();
  FixOrientations();
  DoOffset(delta);

  //now clean up 'corners' ...
  Clipper clpr;
  clpr.AddPaths(m_destPolys, ptSubject, true);
  if (delta > 0)
  {
    clpr.Execute(ctUnion, solution, pftPositive, pftPositive);
  }
  else
  {
    IntRect r = clpr.GetBounds();
    Path outer(4);
    outer[0] = IntPoint(r.left - 10, r.bottom + 10);
    outer[1] = IntPoint(r.right + 10, r.bottom + 10);
    outer[2] = IntPoint(r.right + 10, r.top - 10);
    outer[3] = IntPoint(r.left - 10, r.top - 10);

    clpr.AddPath(outer, ptSubject, true);
    clpr.ReverseSolution(true);
    clpr.Execute(ctUnion, solution, pftNegative, pftNegative);
    //remove the outer PolyNode rectangle ...
    if (solution.ChildCount() == 1 && solution.Childs[0]->ChildCount() > 0)
    {
      PolyNode* outerNode = solution.Childs[0];
      solution.Childs.reserve(outerNode->ChildCount());
      solution.Childs[0] = outerNode->Childs[0];
      solution.Childs[0]->Parent = outerNode->Parent;
      for (int i = 1; i < outerNode->ChildCount(); ++i)
        solution.AddChild(*outerNode->Childs[i]);
    }
    else
      solution.Clear();
  }
}